

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_10x26_impl.h
# Opt level: O0

void secp256k1_fe_storage_cmov(secp256k1_fe_storage *r,secp256k1_fe_storage *a,int flag)

{
  uint uVar1;
  uint uVar2;
  uint32_t mask1;
  uint32_t mask0;
  int flag_local;
  secp256k1_fe_storage *a_local;
  secp256k1_fe_storage *r_local;
  
  uVar1 = flag - 1;
  uVar2 = uVar1 ^ 0xffffffff;
  r->n[0] = r->n[0] & uVar1 | a->n[0] & uVar2;
  r->n[1] = r->n[1] & uVar1 | a->n[1] & uVar2;
  r->n[2] = r->n[2] & uVar1 | a->n[2] & uVar2;
  r->n[3] = r->n[3] & uVar1 | a->n[3] & uVar2;
  r->n[4] = r->n[4] & uVar1 | a->n[4] & uVar2;
  r->n[5] = r->n[5] & uVar1 | a->n[5] & uVar2;
  r->n[6] = r->n[6] & uVar1 | a->n[6] & uVar2;
  r->n[7] = r->n[7] & uVar1 | a->n[7] & uVar2;
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_fe_storage_cmov(secp256k1_fe_storage *r, const secp256k1_fe_storage *a, int flag) {
    uint32_t mask0, mask1;
    mask0 = flag + ~((uint32_t)0);
    mask1 = ~mask0;
    r->n[0] = (r->n[0] & mask0) | (a->n[0] & mask1);
    r->n[1] = (r->n[1] & mask0) | (a->n[1] & mask1);
    r->n[2] = (r->n[2] & mask0) | (a->n[2] & mask1);
    r->n[3] = (r->n[3] & mask0) | (a->n[3] & mask1);
    r->n[4] = (r->n[4] & mask0) | (a->n[4] & mask1);
    r->n[5] = (r->n[5] & mask0) | (a->n[5] & mask1);
    r->n[6] = (r->n[6] & mask0) | (a->n[6] & mask1);
    r->n[7] = (r->n[7] & mask0) | (a->n[7] & mask1);
}